

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::encode_bits(symbol_codec *this,uint bits,uint num_bits)

{
  uint in_EDX;
  undefined8 in_RDI;
  symbol_codec *unaff_retaddr;
  uint bits_00;
  
  if (in_EDX != 0) {
    bits_00 = (uint)((ulong)in_RDI >> 0x20);
    if (in_EDX < 0x11) {
      record_put_bits(unaff_retaddr,bits_00,(uint)in_RDI);
    }
    else {
      record_put_bits(unaff_retaddr,bits_00,(uint)in_RDI);
      record_put_bits(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
    }
  }
  return;
}

Assistant:

void symbol_codec::encode_bits(uint bits, uint num_bits) {
  CRNLIB_ASSERT(m_mode == cEncoding);

  if (!num_bits)
    return;

  CRNLIB_ASSERT((num_bits == 32) || (bits <= ((1U << num_bits) - 1)));

  if (num_bits > 16) {
    record_put_bits(bits >> 16, num_bits - 16);
    record_put_bits(bits & 0xFFFF, 16);
  } else
    record_put_bits(bits, num_bits);
}